

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int compare_floats(FloatParts a,FloatParts b,_Bool is_quiet,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float_status *s_local;
  _Bool is_quiet_local;
  FloatParts b_local;
  FloatParts a_local;
  
  uVar3 = b.frac;
  uVar4 = a.frac;
  a_local.frac._4_1_ = a.cls;
  _Var1 = is_nan(a_local.frac._4_1_);
  b_local.frac._4_1_ = b.cls;
  if ((_Var1) || (_Var1 = is_nan(b_local.frac._4_1_), _Var1)) {
    if (((!is_quiet) || (a_local.frac._4_1_ == float_class_snan)) ||
       (b_local.frac._4_1_ == float_class_snan)) {
      s->float_exception_flags = s->float_exception_flags | 1;
    }
    a_local.cls = float_class_normal;
    a_local.sign = false;
    a_local._14_2_ = 0;
  }
  else {
    b_local.frac._5_1_ = b.sign;
    if (a_local.frac._4_1_ == float_class_zero) {
      if (b_local.frac._4_1_ == float_class_zero) {
        a_local.cls = float_class_unclassified;
        a_local.sign = false;
        a_local._14_2_ = 0;
      }
      else {
        a_local.cls = ~float_class_unclassified;
        a_local.sign = true;
        a_local._14_2_ = 0xffff;
        if (((undefined1  [16])b & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          a_local.cls = float_class_zero;
          a_local.sign = false;
          a_local._14_2_ = 0;
        }
      }
    }
    else {
      a_local.frac._5_1_ = a.sign;
      if (b_local.frac._4_1_ == float_class_zero) {
        a_local.cls = float_class_zero;
        a_local.sign = false;
        a_local._14_2_ = 0;
        if (((undefined1  [16])a & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          a_local.cls = ~float_class_unclassified;
          a_local.sign = true;
          a_local._14_2_ = 0xffff;
        }
      }
      else if (a_local.frac._4_1_ == float_class_inf) {
        if ((b_local.frac._4_1_ == float_class_inf) &&
           ((a_local.frac._5_1_ & 1U) == (b_local.frac._5_1_ & 1U))) {
          a_local.cls = float_class_unclassified;
          a_local.sign = false;
          a_local._14_2_ = 0;
        }
        else {
          a_local.cls = float_class_zero;
          a_local.sign = false;
          a_local._14_2_ = 0;
          if (((undefined1  [16])a & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            a_local.cls = ~float_class_unclassified;
            a_local.sign = true;
            a_local._14_2_ = 0xffff;
          }
        }
      }
      else if (b_local.frac._4_1_ == float_class_inf) {
        a_local.cls = ~float_class_unclassified;
        a_local.sign = true;
        a_local._14_2_ = 0xffff;
        if (((undefined1  [16])b & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          a_local.cls = float_class_zero;
          a_local.sign = false;
          a_local._14_2_ = 0;
        }
      }
      else if ((a_local.frac._5_1_ & 1U) == (b_local.frac._5_1_ & 1U)) {
        a_local.frac._0_4_ = a.exp;
        b_local.frac._0_4_ = b.exp;
        if ((int)a_local.frac == (int)b_local.frac) {
          if (uVar4 == uVar3) {
            a_local.cls = float_class_unclassified;
            a_local.sign = false;
            a_local._14_2_ = 0;
          }
          else if (((undefined1  [16])a & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0)
          {
            a_local.cls = ~float_class_unclassified;
            a_local.sign = true;
            a_local._14_2_ = 0xffff;
            if (uVar3 < uVar4) {
              a_local.cls = float_class_zero;
              a_local.sign = false;
              a_local._14_2_ = 0;
            }
          }
          else {
            a_local.cls = float_class_zero;
            a_local.sign = false;
            a_local._14_2_ = 0;
            if (uVar3 < uVar4) {
              a_local.cls = ~float_class_unclassified;
              a_local.sign = true;
              a_local._14_2_ = 0xffff;
            }
          }
        }
        else if (((undefined1  [16])a & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
          a_local.cls = ~float_class_unclassified;
          a_local.sign = true;
          a_local._14_2_ = 0xffff;
          if ((int)b_local.frac < (int)a_local.frac) {
            a_local.cls = float_class_zero;
            a_local.sign = false;
            a_local._14_2_ = 0;
          }
        }
        else {
          a_local.cls = float_class_zero;
          a_local.sign = false;
          a_local._14_2_ = 0;
          if ((int)b_local.frac < (int)a_local.frac) {
            a_local.cls = ~float_class_unclassified;
            a_local.sign = true;
            a_local._14_2_ = 0xffff;
          }
        }
      }
      else {
        a_local.cls = float_class_zero;
        a_local.sign = false;
        a_local._14_2_ = 0;
        if (((undefined1  [16])a & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          a_local.cls = ~float_class_unclassified;
          a_local.sign = true;
          a_local._14_2_ = 0xffff;
        }
      }
    }
  }
  iVar2._0_1_ = a_local.cls;
  iVar2._1_1_ = a_local.sign;
  iVar2._2_2_ = a_local._14_2_;
  return iVar2;
}

Assistant:

static int compare_floats(FloatParts a, FloatParts b, bool is_quiet,
                          float_status *s)
{
    if (is_nan(a.cls) || is_nan(b.cls)) {
        if (!is_quiet ||
            a.cls == float_class_snan ||
            b.cls == float_class_snan) {
            s->float_exception_flags |= float_flag_invalid;
        }
        return float_relation_unordered;
    }

    if (a.cls == float_class_zero) {
        if (b.cls == float_class_zero) {
            return float_relation_equal;
        }
        return b.sign ? float_relation_greater : float_relation_less;
    } else if (b.cls == float_class_zero) {
        return a.sign ? float_relation_less : float_relation_greater;
    }

    /* The only really important thing about infinity is its sign. If
     * both are infinities the sign marks the smallest of the two.
     */
    if (a.cls == float_class_inf) {
        if ((b.cls == float_class_inf) && (a.sign == b.sign)) {
            return float_relation_equal;
        }
        return a.sign ? float_relation_less : float_relation_greater;
    } else if (b.cls == float_class_inf) {
        return b.sign ? float_relation_greater : float_relation_less;
    }

    if (a.sign != b.sign) {
        return a.sign ? float_relation_less : float_relation_greater;
    }

    if (a.exp == b.exp) {
        if (a.frac == b.frac) {
            return float_relation_equal;
        }
        if (a.sign) {
            return a.frac > b.frac ?
                float_relation_less : float_relation_greater;
        } else {
            return a.frac > b.frac ?
                float_relation_greater : float_relation_less;
        }
    } else {
        if (a.sign) {
            return a.exp > b.exp ? float_relation_less : float_relation_greater;
        } else {
            return a.exp > b.exp ? float_relation_greater : float_relation_less;
        }
    }
}